

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

string * flatbuffers::WordWrap
                   (string *__return_storage_ptr__,string *in,size_t max_length,
                   string *wrapped_line_prefix,string *wrapped_line_suffix)

{
  bool bVar1;
  istream *piVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_1f8 [8];
  string word;
  string line;
  istringstream local_1b0 [8];
  istringstream in_stream;
  string *wrapped_line_suffix_local;
  string *wrapped_line_prefix_local;
  size_t max_length_local;
  string *in_local;
  string *wrapped;
  
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)in,_S_in);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)(word.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_1f8);
  std::operator>>((istream *)local_1b0,(string *)local_1f8);
  std::__cxx11::string::operator=((string *)(word.field_2._M_local_buf + 8),(string *)local_1f8);
  while( true ) {
    piVar2 = std::operator>>((istream *)local_1b0,(string *)local_1f8);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    lVar3 = std::__cxx11::string::length();
    lVar4 = std::__cxx11::string::length();
    lVar5 = std::__cxx11::string::length();
    if ((ulong)(lVar3 + 1 + lVar4 + lVar5) < max_length) {
      std::operator+(&local_228," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8)
      ;
      std::__cxx11::string::operator+=
                ((string *)(word.field_2._M_local_buf + 8),(string *)&local_228);
      std::__cxx11::string::~string((string *)&local_228);
    }
    else {
      std::operator+(&local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&word.field_2 + 8),wrapped_line_suffix);
      std::operator+(&local_248,&local_268,"\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::operator+(&local_288,wrapped_line_prefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8)
      ;
      std::__cxx11::string::operator=
                ((string *)(word.field_2._M_local_buf + 8),(string *)&local_288);
      std::__cxx11::string::~string((string *)&local_288);
    }
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,(string *)(word.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)(word.field_2._M_local_buf + 8));
  std::__cxx11::istringstream::~istringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string WordWrap(const std::string in, size_t max_length,
                            const std::string wrapped_line_prefix,
                            const std::string wrapped_line_suffix) {
  std::istringstream in_stream(in);
  std::string wrapped, line, word;

  in_stream >> word;
  line = word;

  while (in_stream >> word) {
    if ((line.length() + 1 + word.length() + wrapped_line_suffix.length()) <
        max_length) {
      line += " " + word;
    } else {
      wrapped += line + wrapped_line_suffix + "\n";
      line = wrapped_line_prefix + word;
    }
  }
  wrapped += line;

  return wrapped;
}